

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  __node_base_ptr p_Var2;
  int port_00;
  int thread_num;
  int block_size_00;
  int session_count_00;
  int timeout_00;
  ostream *this;
  CppNet *this_00;
  Client *local_218;
  code *local_210;
  undefined8 local_208;
  type local_200;
  connect_call_back local_1e8;
  Client *local_1c8;
  code *local_1c0;
  undefined8 local_1b8;
  type local_1b0;
  read_call_back local_198;
  Client *local_178;
  code *local_170;
  undefined8 local_168;
  type local_160;
  connect_call_back local_148;
  undefined1 local_128 [8];
  Client client;
  CppNet *net;
  int timeout;
  int session_count;
  int block_size;
  int threadCount;
  int port;
  allocator local_39;
  string local_38 [8];
  string ip;
  char **argv_local;
  int argc_local;
  
  if (argc < 7) {
    this = std::operator<<((ostream *)&std::cout,
                           "please input [ip] [port] [thread count] [block size] [session count] [time out]"
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    port_00 = atoi(argv[2]);
    thread_num = atoi(argv[3]);
    block_size_00 = atoi(argv[4]);
    session_count_00 = atoi(argv[5]);
    timeout_00 = atoi(argv[6]);
    this_00 = (CppNet *)operator_new(0x10);
    cppnet::CppNet::CppNet(this_00);
    client._sessions._M_h._M_single_bucket = (__node_base_ptr)this_00;
    cppnet::CppNet::Init(this_00,thread_num);
    Client::Client((Client *)local_128,block_size_00,session_count_00,timeout_00,(string *)local_38,
                   port_00,(CppNet *)client._sessions._M_h._M_single_bucket);
    p_Var2 = client._sessions._M_h._M_single_bucket;
    local_170 = Client::OnConnect;
    local_168 = 0;
    local_178 = (Client *)local_128;
    std::
    bind<void(Client::*)(std::shared_ptr<cppnet::CNSocket>,unsigned_int),Client*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (&local_160,(offset_in_Client_to_subr *)&local_170,&local_178,
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
    std::function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>::
    function<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>,void>
              ((function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)> *)&local_148,
               &local_160);
    cppnet::CppNet::SetConnectionCallback((CppNet *)p_Var2,&local_148);
    std::function<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>::~function(&local_148);
    p_Var2 = client._sessions._M_h._M_single_bucket;
    local_1c0 = Client::OnMessage;
    local_1b8 = 0;
    local_1c8 = (Client *)local_128;
    std::
    bind<void(Client::*)(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int),Client*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
              (&local_1b0,(offset_in_Client_to_subr *)&local_1c0,&local_1c8,
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
               (_Placeholder<3> *)&std::placeholders::_3);
    std::
    function<void(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int)>::
    function<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int)>,void>
              ((function<void(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int)>
                *)&local_198,&local_1b0);
    cppnet::CppNet::SetReadCallback((CppNet *)p_Var2,&local_198);
    std::
    function<void_(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int)>
    ::~function(&local_198);
    p_Var2 = client._sessions._M_h._M_single_bucket;
    local_210 = Client::OnDisconnect;
    local_208 = 0;
    local_218 = (Client *)local_128;
    std::
    bind<void(Client::*)(std::shared_ptr<cppnet::CNSocket>,unsigned_int),Client*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (&local_200,(offset_in_Client_to_subr *)&local_210,&local_218,
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
    std::function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>::
    function<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>,void>
              ((function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)> *)&local_1e8,
               &local_200);
    cppnet::CppNet::SetDisconnectionCallback((CppNet *)p_Var2,&local_1e8);
    std::function<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>::~function(&local_1e8);
    Client::Start((Client *)local_128);
    cppnet::CppNet::Join((CppNet *)client._sessions._M_h._M_single_bucket);
    p_Var2 = client._sessions._M_h._M_single_bucket;
    if (client._sessions._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      cppnet::CppNet::~CppNet((CppNet *)client._sessions._M_h._M_single_bucket);
      operator_delete(p_Var2);
    }
    argv_local._4_4_ = 0;
    Client::~Client((Client *)local_128);
    std::__cxx11::string::~string(local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {

    if (argc < 7) {
       std::cout << "please input [ip] [port] [thread count] [block size] [session count] [time out]" << std::endl;
       return -1;
    }
    
    std::string ip    = std::string(argv[1]);
    int port          = atoi(argv[2]);
    int threadCount   = atoi(argv[3]);
    int block_size    = atoi(argv[4]);
    int session_count = atoi(argv[5]);
    int timeout       = atoi(argv[6]);

    cppnet::CppNet* net = new cppnet::CppNet;
    net->Init(threadCount);

    Client client(block_size, session_count, timeout, ip, port, net);

    net->SetConnectionCallback(std::bind(&Client::OnConnect, &client, std::placeholders::_1, std::placeholders::_2));
    net->SetReadCallback(std::bind(&Client::OnMessage, &client, std::placeholders::_1, std::placeholders::_2,
                                   std::placeholders::_3));
    net->SetDisconnectionCallback(std::bind(&Client::OnDisconnect, &client, std::placeholders::_1, std::placeholders::_2));

    client.Start();

    net->Join();

    delete net;

    return 0;
}